

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O2

bool __thiscall
crnlib::ktx_texture::get_key_value_as_string(ktx_texture *this,char *pKey,dynamic_string *str)

{
  uint uVar1;
  uint8_vec *puVar2;
  size_t sVar3;
  ulong uVar4;
  uint buf_size;
  
  puVar2 = find_key(this,pKey);
  if (puVar2 == (uint8_vec *)0x0) {
    dynamic_string::clear(str);
  }
  else {
    sVar3 = strlen(pKey);
    uVar1 = (int)sVar3 + 1;
    buf_size = puVar2->m_size - uVar1;
    for (uVar4 = 0; buf_size != uVar4; uVar4 = uVar4 + 1) {
      if ((puVar2->m_p + uVar1)[uVar4] == '\0') {
        buf_size = (uint)uVar4;
        break;
      }
    }
    dynamic_string::set_from_buf(str,puVar2->m_p + uVar1,buf_size);
  }
  return puVar2 != (uint8_vec *)0x0;
}

Assistant:

bool ktx_texture::get_key_value_as_string(const char* pKey, dynamic_string& str) const
    {
        const uint8_vec* p = find_key(pKey);
        if (!p)
        {
            str.clear();
            return false;
        }

        const uint ofs = (static_cast<uint>(strlen(pKey)) + 1);
        const uint8* pValue = p->get_ptr() + ofs;
        const uint n = p->size() - ofs;

        uint i;
        for (i = 0; i < n; i++)
        {
            if (!pValue[i])
            {
                break;
            }
        }

        str.set_from_buf(pValue, i);
        return true;
    }